

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# child-typer.h
# Opt level: O2

void __thiscall
wasm::ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector>::visitRefCast
          (ChildTyper<wasm::IRBuilder::ChildPopper::ConstraintCollector> *this,RefCast *curr)

{
  BasicHeapType BVar1;
  HeapType heapType;
  HeapType local_30;
  Type local_28;
  
  local_30 = wasm::Type::getHeapType
                       (&(curr->super_SpecificExpression<(wasm::Expression::Id)63>).super_Expression
                         .type);
  BVar1 = HeapType::getTop(&local_30);
  heapType.id._4_4_ = 0;
  heapType.id._0_4_ = BVar1;
  wasm::Type::Type(&local_28,heapType,Nullable,Inexact);
  IRBuilder::ChildPopper::ConstraintCollector::noteSubtype
            ((ConstraintCollector *)this,&curr->ref,local_28);
  return;
}

Assistant:

void visitRefCast(RefCast* curr) {
    auto top = curr->type.getHeapType().getTop();
    note(&curr->ref, Type(top, Nullable));
  }